

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall shaping_clipper::generate_spread_table(shaping_clipper *this)

{
  pointer pfVar1;
  pointer ppVar2;
  pointer piVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  double dVar15;
  float fVar16;
  ulong local_48;
  
  lVar9 = 0;
  local_48 = 1;
  uVar8 = 0;
  while( true ) {
    iVar12 = this->num_psy_bins;
    uVar7 = (uint)uVar8;
    if (iVar12 <= (int)uVar7) break;
    uVar14 = (long)(int)(uVar7 * 3) / 4;
    uVar4 = uVar7 + 1;
    iVar5 = (int)(uVar7 * 4 + 6) / 3;
    if (iVar12 <= iVar5) {
      iVar5 = iVar12;
    }
    iVar12 = iVar12 * (int)lVar9;
    fVar16 = 0.0;
    iVar10 = (int)uVar14;
    uVar14 = uVar14 & 0xffffffff;
    while (iVar13 = (int)uVar14, iVar13 < iVar5) {
      dVar15 = log(((double)iVar13 + 0.5) / ((double)(int)uVar7 + 0.5));
      dVar15 = exp((double)(ABS((float)dVar15) *
                           *(float *)(&DAT_0010b218 + (ulong)(iVar13 < (int)uVar7) * 4)));
      fVar16 = fVar16 + (float)dVar15;
      (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[(int)(this->num_psy_bins / 2 + (iVar12 - uVar7) + iVar13)] =
           (float)dVar15;
      uVar14 = (ulong)(iVar13 + 1);
    }
    iVar13 = this->num_psy_bins;
    pfVar1 = (this->spread_table).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar6 = (long)iVar10; lVar6 < iVar5; lVar6 = lVar6 + 1) {
      iVar11 = ((iVar13 / 2 + iVar12) - uVar7) + (int)lVar6;
      pfVar1[iVar11] = pfVar1[iVar11] / fVar16;
    }
    ppVar2 = (this->spread_table_range).
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
             super__Vector_impl_data._M_start;
    ppVar2[lVar9].first = iVar10 - uVar7;
    ppVar2[lVar9].second = iVar5 - uVar7;
    if (1 < (int)uVar7) {
      if ((uVar7 & uVar7 - 1) == 0) {
        local_48 = uVar8 >> 1;
      }
      uVar4 = (int)local_48 + uVar7;
    }
    piVar3 = (this->spread_table_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar6 = (long)(int)uVar7; lVar6 < (int)uVar4; lVar6 = lVar6 + 1) {
      piVar3[lVar6] = (int)lVar9;
    }
    lVar9 = lVar9 + 1;
    uVar8 = (ulong)uVar4;
  }
  return;
}

Assistant:

void shaping_clipper::generate_spread_table() {
    // Calculate tent-shape function in log-log scale.

    // As an optimization, only consider bins close to "bin"
    // This reduces the number of multiplications needed in calculate_mask_curve
    // The masking contribution at faraway bins is negligeable

    // Another optimization to save memory and speed up the calculation of the
    // spread table is to calculate and store only 2 spread functions per
    // octave, and reuse the same spread function for multiple bins.
    int table_index = 0;
    int bin = 0;
    int increment = 1;
    while (bin < this->num_psy_bins) {
        float sum = 0;
        int base_idx = table_index * this->num_psy_bins;
        int start_bin = bin * 3 / 4;
        int end_bin = std::min(this->num_psy_bins, ((bin + 1) * 4 + 2) / 3);

        for (int j = start_bin; j < end_bin; j++) {
            // add 0.5 so i=0 doesn't get log(0)
            float rel_idx_log = std::abs(log((j + 0.5) / (bin + 0.5)));
            float value;
            if (j >= bin) {
                // mask up
                value = exp(-rel_idx_log * 40);
            } else {
                // mask down
                value = exp(-rel_idx_log * 80);
            }
            // the spreading function is centred in the row
            sum += value;
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] = value;
        }
        // now normalize it
        for (int j = start_bin; j < end_bin; j++) {
            this->spread_table[base_idx + this->num_psy_bins / 2 + j - bin] /= sum;
        }

        this->spread_table_range[table_index] = std::make_pair(start_bin - bin, end_bin - bin);

        int next_bin;
        if (bin <= 1) {
            next_bin = bin + 1;
        } else {
            if ((bin & (bin - 1)) == 0) {
                // power of 2
                increment = bin / 2;
            }
            next_bin = bin + increment;
        }

        // set bins between "bin" and "next_bin" to use this table_index
        for (int i = bin; i < next_bin; i++) {
            this->spread_table_index[i] = table_index;
        }

        bin = next_bin;
        table_index++;
    }
}